

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_string_utf8_index_ref(sexp ctx,sexp self,sexp_sint_t n,sexp str,sexp i)

{
  undefined1 auVar1 [16];
  sexp psVar2;
  sexp_uint_t type_id;
  
  if ((((ulong)str & 3) == 0) && (str->tag == 9)) {
    if (((ulong)i & 1) != 0) {
      psVar2 = sexp_string_index_to_cursor(ctx,self,n,str,i);
      if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0x13)) {
        return psVar2;
      }
      auVar1._8_8_ = (long)psVar2 >> 0x3f;
      auVar1._0_8_ = (ulong)psVar2 & 0xfffffffffffffffd;
      if (SUB168(auVar1 / SEXT816(8),0) < (str->value).uvector.length) {
        psVar2 = sexp_string_utf8_ref(ctx,str,psVar2);
        return psVar2;
      }
      psVar2 = sexp_user_exception(ctx,self,"string-ref: index out of range",i);
      return psVar2;
    }
    type_id = 2;
  }
  else {
    type_id = 9;
    i = str;
  }
  psVar2 = sexp_type_exception(ctx,self,type_id,i);
  return psVar2;
}

Assistant:

sexp sexp_string_utf8_index_ref (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp i) {
  sexp off;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, i);
  off = sexp_string_index_to_cursor(ctx, self, n, str, i);
  if (sexp_exceptionp(off)) return off;
  if (sexp_unbox_string_cursor(off) >= (sexp_sint_t)sexp_string_size(str))
    return sexp_user_exception(ctx, self, "string-ref: index out of range", i);
  return sexp_string_utf8_ref(ctx, str, off);
}